

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getNetCharge(Thermo *this)

{
  Snapshot *this_00;
  bool bVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  double dVar5;
  RealType RVar6;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  MoleculeIterator miter;
  double local_60;
  FluctuatingChargeAdapter local_48;
  FixedChargeAdapter local_40;
  MoleculeIterator local_38;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasNetCharge == false) {
    local_38._M_node = (_Base_ptr)0x0;
    pMVar2 = SimInfo::beginMolecule(this->info_,&local_38);
    if (pMVar2 == (Molecule *)0x0) {
      local_60 = 0.0;
    }
    else {
      local_60 = 0.0;
      do {
        ppAVar3 = (pMVar2->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppAVar3 ==
            (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar4 = (Atom *)0x0;
        }
        else {
          pAVar4 = *ppAVar3;
        }
        while (pAVar4 != (Atom *)0x0) {
          ppAVar3 = ppAVar3 + 1;
          local_40.at_ = pAVar4->atomType_;
          bVar1 = FixedChargeAdapter::isFixedCharge(&local_40);
          dVar5 = 0.0;
          if (bVar1) {
            dVar5 = FixedChargeAdapter::getCharge(&local_40);
          }
          local_48.at_ = pAVar4->atomType_;
          bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_48);
          if (bVar1) {
            dVar5 = dVar5 + *(double *)
                             (*(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->
                                                currentSnapshot_->atomData).flucQPos.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start +
                                       (pAVar4->super_StuntDouble).storage_) +
                             (long)(pAVar4->super_StuntDouble).localIndex_ * 8);
          }
          if (ppAVar3 ==
              (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pAVar4 = (Atom *)0x0;
          }
          else {
            pAVar4 = *ppAVar3;
          }
          local_60 = local_60 + dVar5;
        }
        pMVar2 = SimInfo::nextMolecule(this->info_,&local_38);
      } while (pMVar2 != (Molecule *)0x0);
    }
    Snapshot::setNetCharge(this_00,local_60);
  }
  RVar6 = Snapshot::getNetCharge(this_00);
  return RVar6;
}

Assistant:

RealType Thermo::getNetCharge() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasNetCharge) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      RealType netCharge(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          netCharge += charge;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &netCharge, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      snap->setNetCharge(netCharge);
    }

    return snap->getNetCharge();
  }